

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall REPL::loop(REPL *this)

{
  int iVar1;
  bool bVar2;
  istream *piVar3;
  reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  char *ctx;
  int local_210;
  Position local_20c;
  Position local_204;
  Position pos_1;
  int y_1;
  int x_1;
  Position pos;
  int z;
  int y;
  int x;
  string command;
  istringstream local_1c0 [8];
  istringstream ss;
  string local_30 [8];
  string buffer;
  REPL *this_local;
  
  do {
    std::__cxx11::string::string(local_30);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_30);
    std::__cxx11::istringstream::istringstream(local_1c0,local_30,8);
    std::__cxx11::string::string((string *)&y);
    std::operator>>((istream *)local_1c0,(string *)&y);
    ctx = "START";
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&y,
                            "START");
    if (bVar2) {
      AI::init(&this->ai,(EVP_PKEY_CTX *)ctx);
LAB_001058a5:
      local_210 = 0;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &y,"PLACE");
      if (bVar2) {
        piVar3 = (istream *)std::istream::operator>>((istream *)local_1c0,&z);
        piVar3 = (istream *)std::istream::operator>>(piVar3,&pos.y);
        std::istream::operator>>(piVar3,&pos.x);
        iVar1 = pos.x;
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->board,(long)z);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)pos.y);
        *pvVar5 = iVar1;
        goto LAB_001058a5;
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &y,"DONE");
      if (bVar2) {
        poVar6 = std::operator<<((ostream *)&std::cout,"OK");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        goto LAB_001058a5;
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &y,"BEGIN");
      if (bVar2) {
        _y_1 = AI::begin(&this->ai);
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->board,(long)y_1);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)x_1);
        *pvVar5 = 1;
        poVar6 = operator<<((ostream *)&std::cout,(Position *)&y_1);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        goto LAB_001058a5;
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &y,"TURN");
      if (bVar2) {
        piVar3 = (istream *)std::istream::operator>>((istream *)local_1c0,&pos_1.y);
        std::istream::operator>>(piVar3,&pos_1.x);
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->board,(long)pos_1.y);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)pos_1.x);
        *pvVar5 = 2;
        local_20c.x = pos_1.y;
        local_20c.y = pos_1.x;
        local_204 = AI::turn(&this->ai,&local_20c);
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->board,(long)local_204.x);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)local_204.y);
        *pvVar5 = 1;
        poVar6 = operator<<((ostream *)&std::cout,&local_204);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        goto LAB_001058a5;
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &y,"END");
      if (!bVar2) goto LAB_001058a5;
      local_210 = 3;
    }
    std::__cxx11::string::~string((string *)&y);
    std::__cxx11::istringstream::~istringstream(local_1c0);
    std::__cxx11::string::~string(local_30);
    if (local_210 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void REPL::loop() {
    while (true) {
        string buffer;
        getline(cin, buffer);
        istringstream ss(buffer);

        string command;
        ss >> command;
        if (command == START) {
            ai.init();
        } else if (command == PLACE) {
            int x, y, z;
            ss >> x >> y >> z;
            board[x][y] = z;
        } else if (command == DONE) {
            cout << "OK" << endl;
        } else if (command == BEGIN) {
            Position pos = ai.begin();
            board[pos.x][pos.y] = ME;
            cout << pos << endl;
        } else if (command == TURN) {
            int x, y;
            ss >> x >> y;
            board[x][y] = OTHER;
            Position pos = ai.turn({x, y});
            board[pos.x][pos.y] = ME;
            cout << pos << endl;
        } else if (command == END) {
            break;
        }
    }
}